

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_2d2edf::check<Imath_3_2::half>(istream *is,half c)

{
  float *pfVar1;
  float fVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  uchar b [2];
  
  b = SUB82((ulong)in_RAX >> 0x30,0);
  std::istream::read((char *)is,(long)b);
  poVar3 = std::operator<<((ostream *)&std::cout,"N9Imath_3_24halfE");
  poVar3 = std::operator<<(poVar3,": expected ");
  poVar3 = (ostream *)::operator<<(poVar3,c);
  poVar3 = std::operator<<(poVar3,", got ");
  poVar3 = (ostream *)::operator<<(poVar3,(half)b);
  std::endl<char,std::char_traits<char>>(poVar3);
  fVar2 = *(float *)(_imath_half_to_float_table + (ulong)c._h * 4);
  pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(ushort)b * 4);
  if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = Imath_3_2::half]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}